

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

uint32 Js::JavascriptArray::GetSpreadArgLen(Var spreadArg,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  Var aValue;
  JavascriptArray *this;
  SpreadArgument *this_00;
  undefined4 *puVar3;
  TypedArrayBase *local_48;
  SpreadArgument *spreadFunctionArgs;
  TypedArrayBase *tarr;
  JavascriptArray *arr;
  ScriptContext *scriptContext_local;
  Var spreadArg_local;
  
  aValue = CrossSite::MarshalVar(scriptContext,spreadArg,false);
  this = TryVarToNonES5Array(aValue);
  if (this == (JavascriptArray *)0x0) {
    bVar2 = VarIs<Js::TypedArrayBase>(aValue);
    if (bVar2) {
      local_48 = UnsafeVarTo<Js::TypedArrayBase>(aValue);
    }
    else {
      local_48 = (TypedArrayBase *)0x0;
    }
    if (local_48 == (TypedArrayBase *)0x0) {
      bVar2 = VarIs<Js::SpreadArgument>(aValue);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e2f,"(false)",
                                    "LdCustomSpreadIteratorList should have converted the arg to one of the above types"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      this_00 = VarTo<Js::SpreadArgument>(aValue);
      spreadArg_local._4_4_ = SpreadArgument::GetArgumentSpreadCount(this_00);
    }
    else {
      spreadArg_local._4_4_ = ArrayObject::GetLength((ArrayObject *)local_48);
    }
  }
  else {
    spreadArg_local._4_4_ = ArrayObject::GetLength(&this->super_ArrayObject);
  }
  return spreadArg_local._4_4_;
}

Assistant:

uint32 JavascriptArray::GetSpreadArgLen(Var spreadArg, ScriptContext *scriptContext)
    {
        // A spread argument can be anything that returns a 'length' property, even if that
        // property is null or undefined.
        spreadArg = CrossSite::MarshalVar(scriptContext, spreadArg);
        JavascriptArray *arr = JavascriptArray::TryVarToNonES5Array(spreadArg);
        if (arr)
        {
            return arr->GetLength();
        }

        TypedArrayBase *tarr = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(spreadArg);
        if (tarr)
        {
            return tarr->GetLength();
        }

        if (VarIs<SpreadArgument>(spreadArg))
        {
            SpreadArgument *spreadFunctionArgs = VarTo<SpreadArgument>(spreadArg);
            return spreadFunctionArgs->GetArgumentSpreadCount();
        }

        AssertMsg(false, "LdCustomSpreadIteratorList should have converted the arg to one of the above types");
        Throw::FatalInternalError();
    }